

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn64.c
# Opt level: O0

void sparc_release(void *ctx)

{
  void *ctx_local;
  
  release_common(ctx);
  return;
}

Assistant:

static void sparc_release(void *ctx)
{
    release_common(ctx);

#if 0
    int i;
    TCGContext *tcg_ctx = (TCGContext *) ctx;
    SPARCCPU *cpu = SPARC_CPU(tcg_ctx->uc->cpu);
    CPUSPARCState *env = &cpu->env;

    g_free(tcg_ctx->cpu_wim);
    g_free(tcg_ctx->cpu_cond);
    g_free(tcg_ctx->cpu_cc_src);
    g_free(tcg_ctx->cpu_cc_src2);
    g_free(tcg_ctx->cpu_cc_dst);
    g_free(tcg_ctx->cpu_fsr);
    g_free(tcg_ctx->sparc_cpu_pc);
    g_free(tcg_ctx->cpu_npc);
    g_free(tcg_ctx->cpu_y);
    g_free(tcg_ctx->cpu_tbr);

    for (i = 0; i < 8; i++) {
      g_free(tcg_ctx->cpu_gregs[i]);
    }
    for (i = 0; i < 32; i++) {
        g_free(tcg_ctx->cpu_gpr[i]);
    }

    g_free(tcg_ctx->cpu_PC);
    g_free(tcg_ctx->btarget);
    g_free(tcg_ctx->bcond);
    g_free(tcg_ctx->cpu_dspctrl);

    g_free(tcg_ctx->tb_ctx.tbs);

    g_free(env->def);
#endif
}